

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O1

int cmdline_parser_dump(FILE *outfile,gengetopt_args_info *args_info)

{
  uint uVar1;
  char **ppcVar2;
  char **in_RCX;
  char *pcVar3;
  int iVar4;
  long lVar5;
  
  if (outfile == (FILE *)0x0) {
    cmdline_parser_dump_cold_1();
    iVar4 = 1;
  }
  else {
    if (args_info->help_given != 0) {
      fprintf((FILE *)outfile,"%s\n","help");
    }
    if (args_info->version_given != 0) {
      fprintf((FILE *)outfile,"%s\n","version");
    }
    if (args_info->output_given != 0) {
      write_into_file(outfile,"output",args_info->output_orig,in_RCX);
    }
    if (args_info->latticeConstant_given != 0) {
      write_into_file(outfile,"latticeConstant",args_info->latticeConstant_orig,in_RCX);
    }
    if (args_info->radius_given != 0) {
      write_into_file(outfile,"radius",args_info->radius_orig,in_RCX);
    }
    if (args_info->length_given != 0) {
      write_into_file(outfile,"length",args_info->length_orig,in_RCX);
    }
    uVar1 = args_info->shellRadius_given;
    if (0 < (long)(int)uVar1) {
      ppcVar2 = args_info->shellRadius_orig;
      lVar5 = 0;
      do {
        if (ppcVar2 == (char **)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = ppcVar2[lVar5];
        }
        write_into_file(outfile,"shellRadius",pcVar3,in_RCX);
        lVar5 = lVar5 + 1;
      } while ((int)uVar1 != lVar5);
    }
    uVar1 = args_info->molFraction_given;
    if (0 < (long)(int)uVar1) {
      ppcVar2 = args_info->molFraction_orig;
      lVar5 = 0;
      do {
        if (ppcVar2 == (char **)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = ppcVar2[lVar5];
        }
        write_into_file(outfile,"molFraction",pcVar3,in_RCX);
        lVar5 = lVar5 + 1;
      } while ((int)uVar1 != lVar5);
    }
    if (args_info->vacancyPercent_given != 0) {
      write_into_file(outfile,"vacancyPercent",args_info->vacancyPercent_orig,in_RCX);
    }
    if (args_info->vacancyInnerRadius_given != 0) {
      write_into_file(outfile,"vacancyInnerRadius",args_info->vacancyInnerRadius_orig,in_RCX);
    }
    iVar4 = 0;
    if (args_info->vacancyOuterRadius_given != 0) {
      write_into_file(outfile,"vacancyOuterRadius",args_info->vacancyOuterRadius_orig,in_RCX);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int
cmdline_parser_dump(FILE *outfile, struct gengetopt_args_info *args_info)
{
  int i = 0;

  if (!outfile)
    {
      fprintf (stderr, "%s: cannot dump options to stream\n", CMDLINE_PARSER_PACKAGE);
      return EXIT_FAILURE;
    }

  if (args_info->help_given)
    write_into_file(outfile, "help", 0, 0 );
  if (args_info->version_given)
    write_into_file(outfile, "version", 0, 0 );
  if (args_info->output_given)
    write_into_file(outfile, "output", args_info->output_orig, 0);
  if (args_info->latticeConstant_given)
    write_into_file(outfile, "latticeConstant", args_info->latticeConstant_orig, 0);
  if (args_info->radius_given)
    write_into_file(outfile, "radius", args_info->radius_orig, 0);
  if (args_info->length_given)
    write_into_file(outfile, "length", args_info->length_orig, 0);
  write_multiple_into_file(outfile, args_info->shellRadius_given, "shellRadius", args_info->shellRadius_orig, 0);
  write_multiple_into_file(outfile, args_info->molFraction_given, "molFraction", args_info->molFraction_orig, 0);
  if (args_info->vacancyPercent_given)
    write_into_file(outfile, "vacancyPercent", args_info->vacancyPercent_orig, 0);
  if (args_info->vacancyInnerRadius_given)
    write_into_file(outfile, "vacancyInnerRadius", args_info->vacancyInnerRadius_orig, 0);
  if (args_info->vacancyOuterRadius_given)
    write_into_file(outfile, "vacancyOuterRadius", args_info->vacancyOuterRadius_orig, 0);
  

  i = EXIT_SUCCESS;
  return i;
}